

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O0

bool QTestResult::report3WayResult
               (bool success,char *failureMessage,void *lhs,void *rhs,
               _func_char_ptr_void_ptr *lhsFormatter,_func_char_ptr_void_ptr *rhsFormatter,
               char *lhsExpression,char *rhsExpression,_func_char_ptr_void_ptr *actualOrderFormatter
               ,_func_char_ptr_void_ptr *expectedOrderFormatter,void *actualOrder,
               void *expectedOrder,char *expectedExpression,char *file,int line)

{
  int iVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  byte in_DIL;
  code *in_R8;
  code *in_R9;
  long in_FS_OFFSET;
  char *in_stack_00000008;
  long in_stack_00000010;
  code *in_stack_00000018;
  code *in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  char *in_stack_00000038;
  char *macroName;
  unique_ptr<const_char[],_std::default_delete<const_char[]>_> expected;
  unique_ptr<const_char[],_std::default_delete<const_char[]>_> actual;
  unique_ptr<const_char[],_std::default_delete<const_char[]>_> rhsStr;
  unique_ptr<const_char[],_std::default_delete<const_char[]>_> lhsStr;
  string actualExpression;
  char msg [4096];
  char *in_stack_ffffffffffffee78;
  undefined4 in_stack_ffffffffffffee80;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffee84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee88;
  undefined1 in_stack_ffffffffffffee96;
  allocator<char> *in_stack_ffffffffffffeeb0;
  char *in_stack_ffffffffffffeeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeec0;
  int line_00;
  char *in_stack_ffffffffffffeec8;
  undefined7 in_stack_ffffffffffffef00;
  undefined1 in_stack_ffffffffffffef07;
  char *in_stack_ffffffffffffef08;
  undefined4 in_stack_ffffffffffffef10;
  char *msg_00;
  allocator<char> *msg_01;
  ComparisonOperation in_stack_ffffffffffffef68;
  bool local_1091;
  allocator<char> local_1069 [65];
  undefined1 *local_1028;
  undefined1 *puStack_1020;
  undefined1 *local_1018;
  undefined1 *puStack_1010;
  char local_1008 [4096];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_1008,0xaa,0x1000);
  local_1008[0] = '\0';
  if (in_stack_00000008 == (char *)0x0) {
    qt_assert("lhsExpression",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x2e8);
  }
  if (in_stack_00000010 == 0) {
    qt_assert("rhsExpression",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x2e9);
  }
  if (in_stack_00000038 == (char *)0x0) {
    qt_assert("expectedExpression",
              "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qtestresult.cpp"
              ,0x2ea);
  }
  pcVar2 = macroNameForOp(ThreeWayCompare);
  local_1018 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_1010 = &DAT_aaaaaaaaaaaaaaaa;
  local_1028 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_1020 = &DAT_aaaaaaaaaaaaaaaa;
  msg_01 = local_1069;
  msg_00 = in_stack_00000008;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0);
  line_00 = (int)((ulong)in_stack_ffffffffffffeec0 >> 0x20);
  std::operator+(in_stack_ffffffffffffee88,
                 (char *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  std::operator+(in_stack_ffffffffffffee88,
                 (char *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  std::allocator<char>::~allocator(local_1069);
  iVar1 = QTestLog::verboseLevel();
  if (1 < iVar1) {
    in_stack_ffffffffffffef08 = local_1008;
    in_stack_ffffffffffffee78 = in_stack_00000038;
    snprintf(in_stack_ffffffffffffef08,0x1000,"%s(%s, %s, %s)",pcVar2,in_stack_00000008,
             in_stack_00000010);
    QTestLog::info(msg_00,in_stack_ffffffffffffeec8,line_00);
  }
  if ((in_DIL & 1) == 0) {
    pcVar2 = (char *)(*in_R8)(in_RDX);
    std::unique_ptr<char_const[],std::default_delete<char_const[]>>::
    unique_ptr<char_const*,std::default_delete<char_const[]>,void,bool>
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80),
               in_stack_ffffffffffffee78);
    (*in_R9)(in_RCX);
    std::unique_ptr<char_const[],std::default_delete<char_const[]>>::
    unique_ptr<char_const*,std::default_delete<char_const[]>,void,bool>
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80),
               in_stack_ffffffffffffee78);
    (*in_stack_00000018)(in_stack_00000028);
    std::unique_ptr<char_const[],std::default_delete<char_const[]>>::
    unique_ptr<char_const*,std::default_delete<char_const[]>,void,bool>
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80),
               in_stack_ffffffffffffee78);
    (*in_stack_00000020)(in_stack_00000030);
    std::unique_ptr<char_const[],std::default_delete<char_const[]>>::
    unique_ptr<char_const*,std::default_delete<char_const[]>,void,bool>
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80),
               in_stack_ffffffffffffee78);
    if (in_RSI == (char *)0x0) {
      in_RSI = failureMessageForOp(ThreeWayCompare);
    }
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::get
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::get
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
    uVar3 = 7;
    formatFailMessage((char *)msg_01,(size_t)msg_00,
                      (char *)CONCAT44(iVar1,in_stack_ffffffffffffef10),in_stack_ffffffffffffef08,
                      (char *)CONCAT17(in_stack_ffffffffffffef07,in_stack_ffffffffffffef00),pcVar2,
                      in_RSI,in_stack_ffffffffffffef68);
    strlen(local_1008);
    strlen(local_1008);
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::get
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffee84,uVar3));
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::get
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffee84,uVar3));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17d043);
    in_stack_ffffffffffffee80 = 0;
    formatFailMessage((char *)msg_01,(size_t)msg_00,
                      (char *)CONCAT44(iVar1,in_stack_ffffffffffffef10),in_stack_ffffffffffffef08,
                      (char *)CONCAT17(in_stack_ffffffffffffef07,in_stack_ffffffffffffef00),pcVar2,
                      in_RSI,in_stack_ffffffffffffef68);
    local_1091 = checkStatement((bool)in_stack_ffffffffffffee96,(char *)in_stack_ffffffffffffee88,
                                (char *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80
                                                ),in_stack_00000038._4_4_);
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::~unique_ptr
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::~unique_ptr
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::~unique_ptr
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
    std::unique_ptr<const_char[],_std::default_delete<const_char[]>_>::~unique_ptr
              ((unique_ptr<const_char[],_std::default_delete<const_char[]>_> *)
               CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  }
  else {
    if (QTest::expectFailMode != 0) {
      snprintf(local_1008,0x1000,"%s(%s, %s, %s) returned TRUE unexpectedly.",pcVar2,
               in_stack_00000008,in_stack_00000010);
      in_stack_ffffffffffffee78 = in_stack_00000038;
    }
    local_1091 = checkStatement((bool)in_stack_ffffffffffffee96,(char *)in_stack_ffffffffffffee88,
                                (char *)CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80
                                                ),(int)((ulong)in_stack_ffffffffffffee78 >> 0x20));
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffee84,in_stack_ffffffffffffee80));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1091;
}

Assistant:

bool QTestResult::report3WayResult(bool success,
                                   const char *failureMessage,
                                   const void *lhs, const void *rhs,
                                   const char *(*lhsFormatter)(const void*),
                                   const char *(*rhsFormatter)(const void*),
                                   const char *lhsExpression, const char *rhsExpression,
                                   const char *(*actualOrderFormatter)(const void *),
                                   const char *(*expectedOrderFormatter)(const void *),
                                   const void *actualOrder, const void *expectedOrder,
                                   const char *expectedExpression,
                                   const char *file, int line)
{
    char msg[maxMsgLen];
    msg[0] = '\0';

    QTEST_ASSERT(lhsExpression);
    QTEST_ASSERT(rhsExpression);
    QTEST_ASSERT(expectedExpression);
    const char *macroName = macroNameForOp(QTest::ComparisonOperation::ThreeWayCompare);
    const std::string actualExpression = std::string(lhsExpression) + " <=> " + rhsExpression;

    if (QTestLog::verboseLevel() >= 2) {
        std::snprintf(msg, maxMsgLen, "%s(%s, %s, %s)",
                      macroName, lhsExpression, rhsExpression, expectedExpression);
        QTestLog::info(msg, file, line);
    }

    if (success) {
        if (QTest::expectFailMode) {
            std::snprintf(msg, maxMsgLen, "%s(%s, %s, %s) returned TRUE unexpectedly.",
                          macroName, lhsExpression, rhsExpression, expectedExpression);
        }
        return checkStatement(success, msg, file, line);
    }
    const std::unique_ptr<const char[]> lhsStr{lhsFormatter(lhs)};
    const std::unique_ptr<const char[]> rhsStr{rhsFormatter(rhs)};

    const std::unique_ptr<const char[]> actual{actualOrderFormatter(actualOrder)};
    const std::unique_ptr<const char[]> expected{expectedOrderFormatter(expectedOrder)};

    if (!failureMessage)
        failureMessage = failureMessageForOp(QTest::ComparisonOperation::ThreeWayCompare);

    // Left and Right compared parameters of QCOMPARE_3WAY
    formatFailMessage(msg, maxMsgLen, failureMessage,
                      lhsStr.get(), rhsStr.get(),
                      lhsExpression, rhsExpression,
                      QTest::ComparisonOperation::ThreeWayCompare);

    // Actual and Expected results of comparison
    formatFailMessage(msg + strlen(msg), maxMsgLen - strlen(msg), "",
                      actual.get(), expected.get(),
                      actualExpression.c_str(), expectedExpression,
                      QTest::ComparisonOperation::CustomCompare);

    return checkStatement(success, msg, file, line);
}